

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O1

_Bool roaring_bitmap_is_subset(roaring_bitmap_t *r1,roaring_bitmap_t *r2)

{
  ushort uVar1;
  int iVar2;
  uint uVar3;
  uint16_t *puVar4;
  bool bVar5;
  byte bVar6;
  undefined1 uVar7;
  byte bVar8;
  uint uVar9;
  int iVar10;
  long *plVar11;
  uint uVar12;
  long *plVar13;
  int iVar14;
  uint uVar15;
  
  iVar2 = (r1->high_low_container).size;
  uVar15 = 0;
  do {
    if ((iVar2 < 1) || ((r2->high_low_container).size <= (int)uVar15)) {
      return iVar2 == 0;
    }
    uVar1 = *(r1->high_low_container).keys;
    puVar4 = (r2->high_low_container).keys;
    uVar9 = uVar15 & 0xffff;
    if (uVar1 == puVar4[uVar9]) {
      bVar6 = *(r1->high_low_container).typecodes;
      plVar13 = (long *)*(r1->high_low_container).containers;
      if (bVar6 == 4) {
        bVar6 = *(byte *)(plVar13 + 1);
        plVar13 = (long *)*plVar13;
      }
      bVar8 = (r2->high_low_container).typecodes[uVar9];
      plVar11 = (long *)(r2->high_low_container).containers[uVar9];
      if (bVar8 == 4) {
        bVar8 = *(byte *)(plVar11 + 1);
        plVar11 = (long *)*plVar11;
      }
      uVar7 = (*(code *)(&DAT_0012636c +
                        *(int *)(&DAT_0012636c + (ulong)(((uint)bVar8 + (uint)bVar6 * 4) - 5) * 4)))
                        (plVar13,plVar11);
      return (_Bool)uVar7;
    }
    if (uVar1 < puVar4[uVar9]) {
      bVar5 = false;
      uVar12 = uVar15;
    }
    else {
      uVar3 = (r2->high_low_container).size;
      uVar9 = uVar15 + 1;
      bVar5 = true;
      uVar12 = uVar9;
      if (((int)uVar9 < (int)uVar3) && (puVar4[(int)uVar9] < uVar1)) {
        uVar15 = uVar15 + 2;
        iVar14 = 1;
        if ((int)uVar15 < (int)uVar3) {
          iVar10 = 1;
          do {
            iVar14 = iVar10;
            if (uVar1 <= puVar4[(int)uVar15]) goto LAB_0010a576;
            iVar14 = iVar10 * 2;
            uVar15 = uVar9 + iVar10 * 2;
            iVar10 = iVar14;
          } while ((int)uVar15 < (int)uVar3);
        }
        uVar15 = uVar3 - 1;
LAB_0010a576:
        uVar12 = uVar15;
        if (((puVar4[(int)uVar15] != uVar1) && (uVar12 = uVar3, uVar1 <= puVar4[(int)uVar15])) &&
           (uVar12 = uVar15, (iVar14 >> 1) + uVar9 + 1 != uVar15)) {
          uVar9 = (iVar14 >> 1) + uVar9;
          do {
            uVar12 = (int)(uVar9 + uVar15) >> 1;
            if (puVar4[(int)uVar12] == uVar1) break;
            if (uVar1 <= puVar4[(int)uVar12]) {
              uVar15 = uVar12;
              uVar12 = uVar9;
            }
            uVar9 = uVar12;
            uVar12 = uVar15;
          } while (uVar9 + 1 != uVar15);
        }
      }
    }
    uVar15 = uVar12;
    if (!bVar5) {
      return false;
    }
  } while( true );
}

Assistant:

bool roaring_bitmap_is_subset(const roaring_bitmap_t *r1,
                              const roaring_bitmap_t *r2) {
    const roaring_array_t *ra1 = &r1->high_low_container;
    const roaring_array_t *ra2 = &r2->high_low_container;

    const int length1 = ra1->size, length2 = ra2->size;

    int pos1 = 0, pos2 = 0;

    while (pos1 < length1 && pos2 < length2) {
        const uint16_t s1 = ra_get_key_at_index(ra1, (uint16_t)pos1);
        const uint16_t s2 = ra_get_key_at_index(ra2, (uint16_t)pos2);

        if (s1 == s2) {
            uint8_t type1, type2;
            container_t *c1 =
                ra_get_container_at_index(ra1, (uint16_t)pos1, &type1);
            container_t *c2 =
                ra_get_container_at_index(ra2, (uint16_t)pos2, &type2);
            if (!container_is_subset(c1, type1, c2, type2)) return false;
            ++pos1;
            ++pos2;
        } else if (s1 < s2) {  // s1 < s2
            return false;
        } else {  // s1 > s2
            pos2 = ra_advance_until(ra2, s1, pos2);
        }
    }
    if (pos1 == length1)
        return true;
    else
        return false;
}